

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

int getFD(StringRef Filename,error_code *EC,CreationDisposition Disp,FileAccess Access,
         OpenFlags Flags)

{
  bool bVar1;
  error_code eVar2;
  bool local_161;
  Twine local_148;
  int local_130;
  undefined4 uStack_12c;
  error_category *local_128;
  Twine local_120;
  int local_108;
  undefined4 uStack_104;
  error_category *local_100;
  int local_f4 [2];
  int FD;
  error_code local_e0;
  char *local_d0;
  error_code *local_c0;
  char *local_b8;
  OpenFlags local_ac;
  FileAccess local_a8;
  OpenFlags Flags_local;
  FileAccess Access_local;
  CreationDisposition Disp_local;
  error_code *EC_local;
  StringRef Filename_local;
  error_code *local_50;
  char *local_48;
  error_code **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  error_code *local_18;
  int local_c;
  
  local_b8 = (char *)Filename.Length;
  local_c0 = (error_code *)Filename.Data;
  local_ac = Flags;
  local_a8 = Access;
  Flags_local = Disp;
  _Access_local = EC;
  EC_local = local_c0;
  Filename_local.Data = local_b8;
  if ((Access & FA_Write) == 0) {
    __assert_fail("(Access & sys::fs::FA_Write) && \"Cannot make a raw_ostream from a read-only descriptor!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                  ,0x1f8,
                  "int getFD(StringRef, std::error_code &, sys::fs::CreationDisposition, sys::fs::FileAccess, sys::fs::OpenFlags)"
                 );
  }
  local_d0 = "-";
  local_30 = (char *)strlen("-");
  local_50 = local_c0;
  local_48 = local_b8;
  local_38 = local_d0;
  local_40 = &local_50;
  local_161 = false;
  if (local_b8 == local_30) {
    local_18 = local_c0;
    local_20 = local_d0;
    local_28 = local_30;
    if (local_30 == (char *)0x0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_c0,local_d0,(size_t)local_30);
    }
    local_161 = local_c == 0;
  }
  if (local_161) {
    std::error_code::error_code(&local_e0);
    _Access_local->_M_value = local_e0._M_value;
    *(undefined4 *)&_Access_local->field_0x4 = local_e0._4_4_;
    _Access_local->_M_cat = local_e0._M_cat;
    if ((local_ac & F_Text) == F_None) {
      llvm::sys::ChangeStdoutToBinary();
    }
    Filename_local.Length._4_4_ = 1;
  }
  else {
    if ((local_a8 & FA_Read) == 0) {
      llvm::Twine::Twine(&local_148,(StringRef *)&EC_local);
      eVar2 = llvm::sys::fs::openFileForWrite(&local_148,local_f4,Flags_local,local_ac,0x1b6);
      local_128 = eVar2._M_cat;
      local_130 = eVar2._M_value;
      *(ulong *)_Access_local = CONCAT44(uStack_12c,local_130);
      _Access_local->_M_cat = local_128;
    }
    else {
      llvm::Twine::Twine(&local_120,(StringRef *)&EC_local);
      eVar2 = llvm::sys::fs::openFileForReadWrite(&local_120,local_f4,Flags_local,local_ac,0x1b6);
      local_100 = eVar2._M_cat;
      local_108 = eVar2._M_value;
      *(ulong *)_Access_local = CONCAT44(uStack_104,local_108);
      _Access_local->_M_cat = local_100;
    }
    bVar1 = std::error_code::operator_cast_to_bool(_Access_local);
    if (bVar1) {
      Filename_local.Length._4_4_ = -1;
    }
    else {
      Filename_local.Length._4_4_ = local_f4[0];
    }
  }
  return Filename_local.Length._4_4_;
}

Assistant:

static int getFD(StringRef Filename, std::error_code &EC,
                 sys::fs::CreationDisposition Disp, sys::fs::FileAccess Access,
                 sys::fs::OpenFlags Flags) {
  assert((Access & sys::fs::FA_Write) &&
         "Cannot make a raw_ostream from a read-only descriptor!");

  // Handle "-" as stdout. Note that when we do this, we consider ourself
  // the owner of stdout and may set the "binary" flag globally based on Flags.
  if (Filename == "-") {
    EC = std::error_code();
    // If user requested binary then put stdout into binary mode if
    // possible.
    if (!(Flags & sys::fs::OF_Text))
      sys::ChangeStdoutToBinary();
    return STDOUT_FILENO;
  }

  int FD;
  if (Access & sys::fs::FA_Read)
    EC = sys::fs::openFileForReadWrite(Filename, FD, Disp, Flags);
  else
    EC = sys::fs::openFileForWrite(Filename, FD, Disp, Flags);
  if (EC)
    return -1;

  return FD;
}